

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof.c
# Opt level: O2

Vec_Int_t * Proof_CollectUsedRec(Vec_Set_t *vProof,Vec_Int_t *vRoots)

{
  int hNode;
  Vec_Int_t *vUsed;
  int i;
  
  vUsed = Vec_IntAlloc((int)vProof);
  for (i = 0; i < vRoots->nSize; i = i + 1) {
    hNode = Vec_IntEntry(vRoots,i);
    if (-1 < hNode) {
      Proof_CollectUsed_rec(vProof,hNode,vUsed);
    }
  }
  return vUsed;
}

Assistant:

Vec_Int_t * Proof_CollectUsedRec( Vec_Set_t * vProof, Vec_Int_t * vRoots )
{
    Vec_Int_t * vUsed;
    int i, Entry;
    vUsed = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vRoots, Entry, i )
        if ( Entry >= 0 )
            Proof_CollectUsed_rec( vProof, Entry, vUsed );
    return vUsed;
}